

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O3

CK_RV __thiscall
SessionManager::openSession
          (SessionManager *this,Slot *slot,CK_FLAGS flags,CK_VOID_PTR pApplication,CK_NOTIFY notify,
          CK_SESSION_HANDLE_PTR phSession)

{
  long lVar1;
  iterator __position;
  bool bVar2;
  Token *this_00;
  Session *this_01;
  long lVar3;
  CK_SESSION_HANDLE CVar4;
  pointer ppSVar5;
  CK_RV CVar6;
  Session *session;
  MutexLocker lock;
  Session *local_50;
  CK_SESSION_HANDLE *local_48;
  MutexLocker local_40;
  
  if (phSession == (CK_SESSION_HANDLE_PTR)0x0) {
    return 7;
  }
  if (slot == (Slot *)0x0) {
    return 3;
  }
  if ((flags & 4) == 0) {
    return 0xb4;
  }
  local_48 = phSession;
  MutexLocker::MutexLocker(&local_40,this->sessionsMutex);
  this_00 = Slot::getToken(slot);
  if (this_00 == (Token *)0x0) {
    CVar6 = 0xe0;
  }
  else {
    bVar2 = Token::isInitialized(this_00);
    CVar6 = 0xe1;
    if (bVar2) {
      if ((flags & 2) == 0) {
        bVar2 = Token::isSOLoggedIn(this_00);
        CVar6 = 0xb8;
        if (bVar2) goto LAB_0016f168;
      }
      this_01 = (Session *)operator_new(0xa8);
      Session::Session(this_01,slot,SUB41(((uint)flags & 2) >> 1,0),pApplication,notify);
      ppSVar5 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      __position._M_current =
           (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_50 = this_01;
      if ((long)__position._M_current - (long)ppSVar5 != 0) {
        lVar3 = (long)__position._M_current - (long)ppSVar5 >> 3;
        CVar4 = 1;
        do {
          if (ppSVar5[CVar4 - 1] == (Session *)0x0) {
            ppSVar5[CVar4 - 1] = this_01;
            Session::setHandle(this_01,CVar4);
            CVar4 = Session::getHandle(this_01);
            goto LAB_0016f15d;
          }
          lVar1 = (-(ulong)(lVar3 == 0) - lVar3) + CVar4;
          CVar4 = CVar4 + 1;
        } while (lVar1 != 0);
      }
      if (__position._M_current ==
          (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Session*,std::allocator<Session*>>::_M_realloc_insert<Session*const&>
                  ((vector<Session*,std::allocator<Session*>> *)&this->sessions,__position,&local_50
                  );
        ppSVar5 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = this_01;
        ppSVar5 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl
                  .super__Vector_impl_data._M_finish + 1;
        (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppSVar5;
      }
      Session::setHandle(local_50,(long)ppSVar5 -
                                  (long)(this->sessions).
                                        super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3);
      CVar4 = Session::getHandle(local_50);
LAB_0016f15d:
      *local_48 = CVar4;
      CVar6 = 0;
    }
  }
LAB_0016f168:
  MutexLocker::~MutexLocker(&local_40);
  return CVar6;
}

Assistant:

CK_RV SessionManager::openSession
(
	Slot* slot,
	CK_FLAGS flags,
	CK_VOID_PTR pApplication,
	CK_NOTIFY notify,
	CK_SESSION_HANDLE_PTR phSession
)
{
	if (phSession == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (slot == NULL) return CKR_SLOT_ID_INVALID;
	if ((flags & CKF_SERIAL_SESSION) == 0) return CKR_SESSION_PARALLEL_NOT_SUPPORTED;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Get the token
	Token* token = slot->getToken();
	if (token == NULL) return CKR_TOKEN_NOT_PRESENT;
	if (!token->isInitialized()) return CKR_TOKEN_NOT_RECOGNIZED;

	// Can not open a Read-Only session when in SO mode
	if ((flags & CKF_RW_SESSION) == 0 && token->isSOLoggedIn()) return CKR_SESSION_READ_WRITE_SO_EXISTS;

	// TODO: Do we want to check for maximum number of sessions?
	// return CKR_SESSION_COUNT

	// Create the session
	bool rwSession = ((flags & CKF_RW_SESSION) == CKF_RW_SESSION) ? true : false;
	Session* session = new Session(slot, rwSession, pApplication, notify);

	// First fill any empty spot in the list
	for (size_t i = 0; i < sessions.size(); i++)
	{
		if (sessions[i] != NULL)
		{
			continue;
		}

		sessions[i] = session;
		session->setHandle(i + 1);
		*phSession = session->getHandle();

		return CKR_OK;
	}

	// Or add it to the end
	sessions.push_back(session);
	session->setHandle(sessions.size());
	*phSession = session->getHandle();

	return CKR_OK;
}